

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void kj::ArrayDisposer::Dispose_<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::destruct
               (void *ptr)

{
  void *ptr_local;
  
  dtor<kj::_::Tuple<kj::String,kj::Array<unsigned_long>>>
            ((Tuple<kj::String,_kj::Array<unsigned_long>_> *)ptr);
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }